

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpcaf_grammar_repeat(int n,mpc_val_t **xs)

{
  byte bVar1;
  undefined4 uVar2;
  byte *__ptr;
  void *pvVar3;
  mpc_val_t *pmVar4;
  
  __ptr = (byte *)xs[1];
  if (__ptr == (byte *)0x0) {
    return *xs;
  }
  bVar1 = *__ptr;
  if (bVar1 < 0x2b) {
    if (bVar1 == 0x21) {
      free(__ptr);
      pmVar4 = *xs;
      pvVar3 = calloc(1,0x38);
      *(undefined1 *)((long)pvVar3 + 0x30) = 0x12;
      *(mpc_val_t **)((long)pvVar3 + 8) = pmVar4;
      *(code **)((long)pvVar3 + 0x10) = mpc_ast_delete;
LAB_00108101:
      *(code **)((long)pvVar3 + 0x18) = mpcf_ctor_null;
      return pvVar3;
    }
    if (bVar1 != 0x2a) {
LAB_0010809b:
      uVar2 = *(undefined4 *)__ptr;
      free(__ptr);
      pmVar4 = *xs;
      pvVar3 = calloc(1,0x38);
      *(undefined1 *)((long)pvVar3 + 0x30) = 0x16;
      *(undefined4 *)((long)pvVar3 + 8) = uVar2;
      *(code **)((long)pvVar3 + 0x10) = mpcf_fold_ast;
      *(mpc_val_t **)((long)pvVar3 + 0x18) = pmVar4;
      *(code **)((long)pvVar3 + 0x20) = mpc_ast_delete;
      return pvVar3;
    }
    free(__ptr);
    pmVar4 = *xs;
    pvVar3 = calloc(1,0x38);
    *(undefined1 *)((long)pvVar3 + 0x30) = 0x14;
  }
  else {
    if (bVar1 != 0x2b) {
      if (bVar1 != 0x3f) goto LAB_0010809b;
      free(__ptr);
      pmVar4 = *xs;
      pvVar3 = calloc(1,0x38);
      *(undefined1 *)((long)pvVar3 + 0x30) = 0x13;
      *(mpc_val_t **)((long)pvVar3 + 8) = pmVar4;
      goto LAB_00108101;
    }
    free(__ptr);
    pmVar4 = *xs;
    pvVar3 = calloc(1,0x38);
    *(undefined1 *)((long)pvVar3 + 0x30) = 0x15;
  }
  *(mpc_val_t **)((long)pvVar3 + 0x18) = pmVar4;
  *(code **)((long)pvVar3 + 0x10) = mpcf_fold_ast;
  return pvVar3;
}

Assistant:

static mpc_val_t *mpcaf_grammar_repeat(int n, mpc_val_t **xs) {
  int num;
  (void) n;
  if (xs[1] == NULL) { return xs[0]; }
  switch(((char*)xs[1])[0])
  {
    case '*': { free(xs[1]); return mpca_many(xs[0]); }; break;
    case '+': { free(xs[1]); return mpca_many1(xs[0]); }; break;
    case '?': { free(xs[1]); return mpca_maybe(xs[0]); }; break;
    case '!': { free(xs[1]); return mpca_not(xs[0]); }; break;
    default:
      num = *((int*)xs[1]);
      free(xs[1]);
  }
  return mpca_count(num, xs[0]);
}